

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.h
# Opt level: O0

void __thiscall
chrono::ChLoad<MyLoaderTriangular>::LoadGetStateBlock_w
          (ChLoad<MyLoaderTriangular> *this,ChStateDelta *mD)

{
  element_type *peVar1;
  ChStateDelta *local_18;
  ChStateDelta *mD_local;
  ChLoad<MyLoaderTriangular> *this_local;
  
  local_18 = mD;
  mD_local = (ChStateDelta *)this;
  ChLoaderU::GetLoadable((ChLoaderU *)&stack0xffffffffffffffd8);
  peVar1 = std::__shared_ptr_access<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&stack0xffffffffffffffd8);
  (**(code **)(*(long *)peVar1 + 0x28))(peVar1,0,local_18);
  std::shared_ptr<chrono::ChLoadable>::~shared_ptr
            ((shared_ptr<chrono::ChLoadable> *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

inline void ChLoad<Tloader>::LoadGetStateBlock_w(ChStateDelta& mD) {
    this->loader.GetLoadable()->LoadableGetStateBlock_w(0, mD);
}